

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict try_attr_spec(c2m_ctx_t c2m_ctx,pos_t pos,node_t_conflict *asm_part)

{
  short sVar1;
  parse_ctx *ppVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  int iVar5;
  size_t sVar6;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  node_t_conflict op2;
  node *pnVar9;
  node *pnVar10;
  char *pcVar11;
  parse_ctx_t parse_ctx;
  pos_t pVar12;
  str_t sVar13;
  parse_ctx_t parse_ctx_1;
  
  if (c2m_ctx->options->pedantic_p != 0) {
    return (node_t_conflict)0x0;
  }
  if (asm_part != (node_t_conflict *)0x0) {
    *asm_part = (node_t_conflict)0x0;
    sVar6 = record_start(c2m_ctx);
    ppVar2 = c2m_ctx->parse_ctx;
    if (*(short *)ppVar2->curr_token == 0x103) {
      pnVar7 = ppVar2->curr_token->node;
      read_token(c2m_ctx);
      pcVar11 = (pnVar7->u).s.s;
      iVar5 = strcmp(pcVar11,"__asm");
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar11,"asm"), iVar5 != 0)) goto LAB_00197b68;
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) {
        pnVar9 = &err_struct;
        if (ppVar2->record_level != 0) goto LAB_00197c72;
        iVar5 = 0x28;
LAB_00197c38:
        pcVar11 = get_token_name(c2m_ctx,iVar5);
        goto LAB_00197b83;
      }
      read_token(c2m_ctx);
      ptVar4 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar4 == 0x102) {
        pnVar8 = ptVar4->node;
        read_token(c2m_ctx);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
          read_token(c2m_ctx);
          pVar12 = get_node_pos(c2m_ctx,pnVar7);
          pnVar9 = new_pos_node1(c2m_ctx,N_ASM,pVar12,pnVar8);
        }
        else {
          pnVar9 = &err_struct;
          if (ppVar2->record_level == 0) {
            iVar5 = 0x29;
            goto LAB_00197c38;
          }
        }
      }
      else {
        pnVar9 = &err_struct;
        if (ppVar2->record_level == 0) {
          pcVar11 = "string";
          goto LAB_00197b83;
        }
      }
    }
    else {
LAB_00197b68:
      pnVar9 = &err_struct;
      if (ppVar2->record_level == 0) {
        pcVar11 = "identifier";
LAB_00197b83:
        pnVar9 = &err_struct;
        syntax_error(c2m_ctx,pcVar11);
      }
    }
LAB_00197c72:
    record_stop(c2m_ctx,sVar6,(uint)(pnVar9 == &err_struct));
    if (pnVar9 != &err_struct) {
      if (c2m_ctx->options->pedantic_p != 0) {
        error(c2m_ctx,0x1c390a,pos.fname,pos._8_8_);
      }
      *asm_part = pnVar9;
    }
  }
  sVar6 = record_start(c2m_ctx);
  ppVar2 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar2->curr_token == 0x103) {
    pnVar7 = ppVar2->curr_token->node;
    read_token(c2m_ctx);
    pcVar11 = (pnVar7->u).s.s;
    iVar5 = strcmp(pcVar11,"__attribute__");
    if ((iVar5 != 0) && (iVar5 = strcmp(pcVar11,"__mirc_attribute__"), iVar5 != 0))
    goto LAB_00197d24;
    if ((*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) &&
       (read_token(c2m_ctx), *(short *)c2m_ctx->parse_ctx->curr_token == 0x28)) {
      read_token(c2m_ctx);
      pnVar7 = new_node(c2m_ctx,N_LIST);
      do {
        ppVar3 = c2m_ctx->parse_ctx;
        ptVar4 = ppVar3->curr_token;
        iVar5 = *(int *)ptVar4 << 0x10;
        if (iVar5 == 0x290000) {
          pnVar9 = (node_t_conflict)0x0;
        }
        else {
          pnVar9 = (node_t_conflict)0x0;
          if (iVar5 != 0x2c0000) {
            if ((iVar5 >> 0x10) - 0x110U < 0x2d) {
              read_token(c2m_ctx);
              sVar13 = uniq_cstr(c2m_ctx,ptVar4->repr);
              pVar12 = ptVar4->pos;
              pnVar8 = new_node(c2m_ctx,N_ID);
              add_pos(c2m_ctx,pnVar8,pVar12);
              (pnVar8->u).s = sVar13;
LAB_00197e5a:
              op2 = new_node(c2m_ctx,N_LIST);
              pnVar9 = new_node2(c2m_ctx,N_ATTR,pnVar8,op2);
              if (*(short *)ppVar3->curr_token == 0x28) {
                if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
                  do {
                    read_token(c2m_ctx);
                    do {
                      iVar5 = *(int *)ppVar3->curr_token * 0x10000;
                      if (iVar5 < 0x1010000) {
                        if (iVar5 == 0x1000000) goto LAB_00197edf;
                        if (iVar5 == 0x290000) {
                          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
                            read_token(c2m_ctx);
                            goto LAB_00198024;
                          }
                          pnVar9 = &err_struct;
                          if (ppVar3->record_level != 0) goto LAB_00198024;
                          iVar5 = 0x29;
                          goto LAB_00197fed;
                        }
LAB_00197f1b:
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        if (*(short *)ptVar4 != 0x103) {
                          iVar5 = ppVar3->record_level;
                          goto LAB_00197faa;
                        }
                        pnVar8 = ptVar4->node;
                        read_token(c2m_ctx);
                      }
                      else {
                        if ((iVar5 != 0x1020000) && (iVar5 != 0x1010000)) goto LAB_00197f1b;
LAB_00197edf:
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        if (*(int *)ptVar4 << 0x10 != iVar5) {
                          pnVar9 = &err_struct;
                          if (ppVar3->record_level != 0) goto LAB_00198024;
                          iVar5 = (int)*(short *)ppVar3->curr_token;
                          goto LAB_00197fed;
                        }
                        pnVar8 = ptVar4->node;
                        read_token(c2m_ctx);
                      }
                      op_append(c2m_ctx,op2,pnVar8);
                    } while (*(short *)ppVar3->curr_token == 0x29);
                  } while (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c);
                  pnVar9 = &err_struct;
                  if (ppVar3->record_level == 0) {
                    iVar5 = 0x2c;
LAB_00197fed:
                    pcVar11 = get_token_name(c2m_ctx,iVar5);
                    goto LAB_00197ff8;
                  }
                }
                else {
                  pnVar9 = &err_struct;
                  if (ppVar3->record_level == 0) {
                    iVar5 = 0x28;
                    goto LAB_00197fed;
                  }
                }
              }
            }
            else {
              if (iVar5 == 0x1030000) {
                pnVar8 = ptVar4->node;
                read_token(c2m_ctx);
                goto LAB_00197e5a;
              }
              iVar5 = ppVar3->record_level;
LAB_00197faa:
              pnVar9 = &err_struct;
              if (iVar5 != 0) goto LAB_00198024;
              pcVar11 = "identifier";
LAB_00197ff8:
              syntax_error(c2m_ctx,pcVar11);
              pnVar9 = &err_struct;
            }
          }
        }
LAB_00198024:
        pnVar10 = &err_struct;
        if (pnVar9 == &err_struct) goto LAB_001980cf;
        op_append(c2m_ctx,pnVar7,pnVar9);
        sVar1 = *(short *)c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ppVar2->curr_token == 0x29) {
          if (sVar1 == 0x29) {
            read_token(c2m_ctx);
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
              read_token(c2m_ctx);
              pnVar10 = pnVar7;
              goto LAB_001980cf;
            }
            iVar5 = ppVar2->record_level;
          }
          else {
            iVar5 = ppVar2->record_level;
          }
          if (iVar5 != 0) goto LAB_001980cf;
          iVar5 = 0x29;
          goto LAB_001980bf;
        }
        if (sVar1 != 0x2c) goto LAB_00198156;
        read_token(c2m_ctx);
      } while( true );
    }
    pnVar10 = &err_struct;
    if (ppVar2->record_level != 0) goto LAB_001980cf;
    iVar5 = 0x28;
LAB_001980bf:
    pcVar11 = get_token_name(c2m_ctx,iVar5);
  }
  else {
LAB_00197d24:
    pnVar10 = &err_struct;
    if (ppVar2->record_level != 0) goto LAB_001980cf;
    pcVar11 = "identifier";
  }
  syntax_error(c2m_ctx,pcVar11);
  pnVar10 = &err_struct;
LAB_001980cf:
  record_stop(c2m_ctx,sVar6,(uint)(pnVar10 == &err_struct));
  if ((pnVar10 != &err_struct) && (c2m_ctx->options->pedantic_p != 0)) {
    error(c2m_ctx,0x1c3921,pos.fname,pos._8_8_);
  }
  return pnVar10;
LAB_00198156:
  if (ppVar2->record_level == 0) {
    pcVar11 = get_token_name(c2m_ctx,0x2c);
    syntax_error(c2m_ctx,pcVar11);
  }
  goto LAB_001980cf;
}

Assistant:

static node_t try_attr_spec (c2m_ctx_t c2m_ctx, pos_t pos, node_t *asm_part) {
  node_t r;

  if (c2m_options->pedantic_p) return NULL;
  if (asm_part != NULL) {
    *asm_part = NULL;
    if ((r = TRY (asm_spec)) != err_node) {
      if (c2m_options->pedantic_p)
        error (c2m_ctx, pos, "asm is not implemented");
      else {
        /*warning (c2m_ctx, pos, "asm is not implemented -- ignoring it")*/
      }
      *asm_part = r;
    }
  }
  if ((r = TRY (attr_spec)) != err_node) {
    if (c2m_options->pedantic_p)
      error (c2m_ctx, pos, "GCC attributes are not implemented");
    else {
      /*warning (c2m_ctx, pos, "GCC attributes are not implemented -- ignoring them")*/
    }
  }
  return r;
}